

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::common_sendReply
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc,int wait)

{
  OS_Counter *pOVar1;
  TadsHttpRequest *pTVar2;
  long lVar3;
  void *pvVar4;
  uint argc;
  int iVar5;
  wchar_t ch;
  uint uVar6;
  bodyArg *this_00;
  byte *p;
  byte *src;
  ulong uVar7;
  ushort *puVar8;
  ushort *puVar9;
  char *pcVar10;
  HTTPReplySender *this_01;
  http_header *phVar11;
  ssize_t sVar12;
  byte *len_00;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  ulong uVar13;
  byte *ref;
  byte *extraout_RDX_01;
  vm_httpreq_cookie *extraout_RDX_02;
  vm_httpreq_cookie *__buf;
  char *__s;
  int __flags;
  vm_val_t *this_02;
  long *in_FS_OFFSET;
  size_t status_len;
  int32_t len;
  err_frame_t err_cur__;
  char buf [512];
  undefined8 local_338;
  TadsHttpRequest *local_330;
  CVmObjHTTPRequest *local_328;
  int32_t local_31c;
  uint local_318 [2];
  long local_310;
  void *local_308;
  __jmp_buf_tag local_300;
  int local_238 [2];
  char *local_230;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  __flags = wait;
  if (common_sendReply(unsigned_int,vm_val_t*,unsigned_int*,int)::desc == '\0') {
    common_sendReply();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,oargc,&common_sendReply::desc);
  if (iVar5 != 0) {
    return 1;
  }
  local_330 = *(TadsHttpRequest **)(this->super_CVmObject).ext_;
  if ((local_330->super_TadsEventMessage).super_TadsMessage.completed != 0) {
    throw_net_err("request already completed",0);
  }
  this_00 = (bodyArg *)operator_new(0x58);
  bodyArg::bodyArg(this_00,0);
  local_328 = this;
  G_err_frame::__tls_init();
  local_310 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_318;
  local_318[0] = _setjmp(&local_300);
  if (local_318[0] != 0) {
    this_01 = (HTTPReplySender *)0x0;
    goto LAB_00208a34;
  }
  if (this_00->init_err != 0) {
    err_throw(this_00->init_err);
  }
  if (this_00->status_code == 0) {
    __s = (char *)0x0;
    puVar9 = (ushort *)__s;
    if (this_00->none == 0) {
      if ((argc < 2) || (sp_[-2].typ == VM_NIL)) {
        local_338._0_4_ = 0;
        local_31c = 0x200;
        p = (byte *)bodyArg::extract(this_00,(char *)local_238,(int32_t *)&local_338,&local_31c);
        iVar5 = bodyArg::is_text(this_00);
        len_00 = (byte *)(long)local_31c;
        if (iVar5 == 0) {
          if ((((local_31c < 0xb) || (*p != 0xff)) || (p[1] != 0xd8)) ||
             (*(int *)(p + 6) != 0x4649464a)) {
            if (local_31c < 7) {
LAB_002087c8:
              if ((local_31c < 4) || (p[2] != 0x33 || *(short *)p != 0x4449)) {
                if ((local_31c < 0xf) || (*(long *)p != 0x2005367674f || *(long *)(p + 6) != 0)) {
                  if ((local_31c < 5) || (*(int *)p != 0x4468544d)) {
                    if ((local_31c < 9) ||
                       ((__s = "application/x-shockwave-flash",
                        p[2] != 0x53 || *(short *)p != 0x5746 &&
                        (p[2] != 0x53 || *(short *)p != 0x5743)))) {
                      __s = "application/octet-stream";
                    }
                  }
                  else {
                    __s = "audio/midi";
                  }
                }
                else {
                  __s = "application/ogg";
                }
              }
              else {
                __s = "audio/mpeg";
              }
            }
            else {
              __s = "image/gif";
              if ((*(short *)(p + 4) != 0x6137 || *(int *)p != 0x38464947) &&
                 (*(short *)(p + 4) != 0x6139 || *(int *)p != 0x38464947)) {
                if ((local_31c < 7) || (*(short *)(p + 4) != 0xa0d || *(int *)p != 0x474e5089))
                goto LAB_002087c8;
                __s = "image/png";
              }
            }
          }
          else {
            __s = "image/jpeg";
          }
        }
        else {
          ref = extraout_RDX;
          src = p;
          if (local_31c != 0) {
            do {
              if ((len_00 < (byte *)0x4) || (*(int *)p != 0x2d2d213c)) {
                ch = utf8_ptr::s_getch((char *)p);
                uVar6 = t3_get_chartype(ch);
                ref = extraout_RDX_00;
                src = p;
                if ((uVar6 & 0xfffffffe) != 6) break;
                src = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
                len_00 = p + ((long)len_00 - (long)src);
              }
              else {
                do {
                  if (((byte *)0x2 < len_00) && (p[2] == 0x3e && *(short *)p == 0x2d2d)) {
                    uVar13 = (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3);
                    uVar7 = (ulong)(((p[uVar13 + 1] >> 5 & 1) != 0) + 1 &
                                   (uint)(p[uVar13 + 1] >> 7) * 3);
                    ref = p + uVar7 + uVar13 + 1;
                    src = ref + (ulong)(((p[uVar7 + 2 + uVar13] >> 5 & 1) != 0) + 1 &
                                       (uint)(p[uVar7 + 2 + uVar13] >> 7) * 3) + 2;
                    len_00 = p + ((long)len_00 - (long)src);
                    break;
                  }
                  ref = (byte *)(ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3);
                  src = p + (long)ref + 1;
                  len_00 = p + ((long)len_00 - (long)src);
                  p = src;
                } while (len_00 != (byte *)0x0);
              }
              p = src;
            } while (len_00 != (byte *)0x0);
          }
          if (((len_00 < (byte *)0x6) ||
              (iVar5 = memicmp(src,"<html",5), ref = extraout_RDX_01, iVar5 != 0)) &&
             (iVar5 = eq_skip_sp((char *)src,(size_t)len_00,(char *)ref), iVar5 == 0)) {
            if ((len_00 < (byte *)0x6) || (iVar5 = memicmp(src,"<?xml",5), iVar5 != 0)) {
              __s = "text/plain";
            }
            else {
              __s = "text/xml";
            }
          }
          else {
            __s = "text/html";
          }
        }
        puVar9 = (ushort *)strlen(__s);
      }
      else {
        puVar8 = (ushort *)vm_val_t::get_as_string(sp_ + -2);
        if (puVar8 == (ushort *)0x0) {
          err_throw(0x7e3);
        }
        puVar9 = (ushort *)(ulong)*puVar8;
        __s = (char *)(puVar8 + 1);
      }
    }
  }
  else {
    __s = "text/html";
    puVar9 = (ushort *)0x9;
  }
  pcVar10 = get_status_arg(this_00->status_code,2,argc,&local_338);
  if ((argc < 4) || (sp_[-4].typ == VM_NIL)) {
    this_02 = (vm_val_t *)0x0;
  }
  else {
    this_02 = sp_ + -4;
    iVar5 = vm_val_t::is_listlike(this_02);
    if (iVar5 == 0) {
      err_throw(0x7e4);
    }
  }
  this_01 = (HTTPReplySender *)operator_new(0x78);
  pTVar2 = local_330;
  (this_01->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__HTTPReplySender_003527d0;
  this_01->vmg = (vm_globals *)0x0;
  this_01->queue = (TadsMessageQueue *)0x0;
  this_01->reqid = 0;
  this_01->reqvar = (vm_globalvar_t *)0x0;
  this_01->req = (TadsHttpRequest *)0x0;
  this_01->status = (char *)0x0;
  this_01->status_len = 0;
  this_01->headers = (http_header *)0x0;
  this_01->body = (bodyArg *)0x0;
  this_01->cont_type = (char *)0x0;
  this_01->cont_type_len = 0;
  *(undefined8 *)((long)&this_01->cont_type_len + 4) = 0;
  *(undefined8 *)((long)&this_01->cookies + 4) = 0;
  __buf = *(vm_httpreq_cookie **)((local_328->super_CVmObject).ext_ + 8);
  this_01->reqid = self;
  this_01->req = local_330;
  this_01->status = pcVar10;
  this_01->status_len = CONCAT44(local_338._4_4_,(int32_t)local_338);
  this_01->headers = (http_header *)0x0;
  this_01->body = this_00;
  this_01->cont_type = __s;
  this_01->cont_type_len = (size_t)puVar9;
  this_01->cookies = __buf;
  if (this_02 != (vm_val_t *)0x0) {
    phVar11 = http_header::create(this_02);
    this_01->headers = phVar11;
    __buf = extraout_RDX_02;
  }
  LOCK();
  pOVar1 = &(pTVar2->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  if (wait == 0) {
    HTTPReplySender::start_thread(this_01);
  }
  else {
    sVar12 = HTTPReplySender::send(this_01,(int)local_238,__buf,(size_t)this_00,__flags);
    if ((int)sVar12 == 0) {
      throw_net_err(local_230,local_238[0]);
    }
  }
  this_00 = (bodyArg *)0x0;
LAB_00208a34:
  if (-1 < (short)local_318[0]) {
    local_318[0] = local_318[0] | 0x8000;
    if (this_00 != (bodyArg *)0x0) {
      bodyArg::~bodyArg(this_00);
      operator_delete(this_00,0x58);
    }
    if (this_01 != (HTTPReplySender *)0x0) {
      LOCK();
      pOVar1 = &(this_01->super_CVmRefCntObj).cnt;
      (pOVar1->cnt).super___atomic_base<long>._M_i =
           (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
        (*(this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_01);
      }
    }
  }
  lVar3 = local_310;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar3;
  if ((local_318[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar4 = local_308;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar4;
    err_rethrow();
  }
  if ((local_318[0] & 2) != 0) {
    free(local_308);
  }
  sp_ = sp_ + -(long)(int)argc;
  retval->typ = VM_NIL;
  return 1;
}

Assistant:

int CVmObjHTTPRequest::common_sendReply(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc, int wait)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request */
    TadsHttpRequest *req = get_ext()->req;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* get the 'body' argument (leave it on the stack for gc protection) */
    bodyArg *body = new bodyArg(vmg_ 0);

    /* no reply sender yet */
    HTTPReplySender *sender = 0;

    err_try
    {
        /* get the content type, if present */
        const char *cont_type = 0;
        size_t cont_type_len = 0;
        if (body->init_err != 0)
        {
            err_throw(body->init_err);
        }
        else if (body->status_code != 0)
        {
            /* we're using a generated HTML reply, so it's always text/html */
            cont_type = "text/html";
            cont_type_len = 9;
        }
        else if (body->none)
        {
            /* no body -> no content type */
            cont_type = 0;
            cont_type_len = 0;
        }
        else if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
        {
            /* retrieve the content type - this must be a string */
            cont_type = G_stk->get(1)->get_as_string(vmg0_);
            if (cont_type == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* get the length and buffer pointer */
            cont_type_len = vmb_get_len(cont_type);
            cont_type += VMB_LEN;
        }
        else
        {
            /* 
             *   There's no content type argument, so we need to infer the
             *   type from the 'body' argument.  First, extract the initial
             *   section of the content to check for common signatures.  
             */
            char buf[512];
            int32_t ofs = 0, len = sizeof(buf);
            const char *bufp = body->extract(buf, ofs, len);

            /* check to see if the body is text or binary */
            if (body->is_text(vmg0_))
            {
                /* 
                 *   it's text data, so check for tell-tale signs of HTML and
                 *   XML, after skipping leading whitespace and HTML-style
                 *   comments 
                 */
                utf8_ptr p((char *)bufp);
                size_t rem = (size_t)len;
                while (rem != 0)
                {
                    /* if we're at a comment starter, skip the comment */
                    if (rem >= 4 && memcmp(p.getptr(), "<!--", 4) == 0)
                    {
                        /* skip to the closing sequence */
                        for ( ; rem != 0 ; p.inc(&rem))
                        {
                            if (rem >= 3 && memcmp(p.getptr(), "-->", 3) == 0)
                            {
                                /* skip it and stop looking */
                                p.inc(&rem);
                                p.inc(&rem);
                                p.inc(&rem);
                                break;
                            }
                        }

                        /* continue scanning */
                        continue;
                    }

                    /* if we're at any whitespace character, just skip it */
                    if (t3_is_whitespace(p.getch()))
                    {
                        p.inc(&rem);
                        continue;
                    }

                    /* otherwise stop scanning */
                    break;
                }

                /* check for <HTML or <?XML prefixes */
                if ((rem > 5 && memicmp(p.getptr(), "<html", 5) == 0)
                    || eq_skip_sp(p.getptr(), rem, "<!doctype html "))
                {
                    /* it looks like HTML */
                    cont_type = "text/html";
                }
                else if (rem > 5 && memicmp(p.getptr(), "<?xml", 5) == 0)
                {
                    /* it looks like XML */
                    cont_type = "text/xml";
                }
                else
                {
                    /* it doesn't look like HTML or XML, so use plain text */
                    cont_type = "text/plain";
                }
            }
            else
            {
                /* 
                 *   Treat it as binary data.  Check the first few bytes to
                 *   see if the file signature matches a known media type.  
                 */
                if (len > 10
                    && (unsigned char)bufp[0] == 0xff
                    && (unsigned char)bufp[1] == 0xd8
                    && memcmp(bufp+6, "JFIF", 4) == 0)
                {
                    /* it's a JPEG image */
                    cont_type = "image/jpeg";
                }
                else if (len > 6
                         && (memcmp(bufp, "GIF87a", 6) == 0
                             || memcmp(bufp, "GIF89a", 6) == 0))
                {
                    /* it's a GIF image */
                    cont_type = "image/gif";
                }
                else if (len > 6 && memcmp(bufp, "\211PNG\r\n\032\n", 6) == 0)
                {
                    /* it's a PNG image */
                    cont_type = "image/png";
                }
                else if (len > 3 && memcmp(bufp, "ID3", 3) == 0)
                {
                    /* MP3 file */
                    cont_type = "audio/mpeg";
                }
                else if (len > 14 && memcmp(
                    bufp, "OggS\000\002\000\000\000\000\000\000\000\000", 14)
                         == 0)
                {
                    /* Ogg Vorbis audio */
                    cont_type = "application/ogg";
                }
                else if (len > 4 && memcmp(bufp, "MThD", 4) == 0)
                {
                    /* MIDI */
                    cont_type = "audio/midi";
                }
                else if (len > 8
                         && (memcmp(bufp, "FWS", 3) == 0
                             || memcmp(bufp, "CWS", 3) == 0))
                {
                    /* shockwave flash */
                    cont_type = "application/x-shockwave-flash";
                }
                else
                {
                    /* we don't recognize it; use generic binary */
                    cont_type = "application/octet-stream";
                }
            }

            /* get the length of the content type string we selected */
            cont_type_len = strlen(cont_type);
        }

        /* get the result code, if present */
        size_t status_len;
        const char *status = get_status_arg(vmg_ body->status_code,
                                            2, argc, status_len);

        /* get the headers argument */
        vm_val_t *headers = 0;
        if (argc >= 4 && G_stk->get(3)->typ != VM_NIL)
        {
            /* get the headers value */
            headers = G_stk->get(3);

            /* make sure it's a list */
            if (!headers->is_listlike(vmg0_))
                err_throw(VMERR_LIST_VAL_REQD);
        }

        /* set up a reply sender object */
        sender = new HTTPReplySender();
        sender->set_params(
            vmg_ self, req, status, status_len, headers, body,
            cont_type, cont_type_len, get_ext()->cookies);

        /* the sender now owns our 'body' object */
        body = 0;

        /* send the reply, either directly or in a new thread */
        if (wait)
        {
            /* waiting for completion - send in the current thread */
            http_reply_err err;
            if (!sender->send(&err))
                throw_net_err(vmg_ err.msg, err.sock_err);
        }
        else
        {
            /* sending asynchronously - send in a new thread */
            sender->start_thread(vmg0_);
        }
    }